

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<QGesture*,QPointer<QWidget>>::emplace_helper<QPointer<QWidget>>
          (QHash<QGesture_*,_QPointer<QWidget>_> *this,QGesture **key,QPointer<QWidget> *args)

{
  long lVar1;
  piter it;
  piter pVar2;
  iterator<QHashPrivate::Node<QGesture_*,_QPointer<QWidget>_>_> *in_RDX;
  Data<QHashPrivate::Node<QGesture_*,_QPointer<QWidget>_>_> *in_RSI;
  long in_FS_OFFSET;
  InsertionResult result;
  iterator *in_stack_ffffffffffffff88;
  Data<QHashPrivate::Node<QGesture_*,_QPointer<QWidget>_>_> *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  undefined8 local_30;
  undefined8 local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QHashPrivate::Data<QHashPrivate::Node<QGesture*,QPointer<QWidget>>>::findOrInsert<QGesture*>
            (in_RSI,(QGesture **)in_RDX);
  QHashPrivate::iterator<QHashPrivate::Node<QGesture_*,_QPointer<QWidget>_>_>::node(in_RDX);
  QHashPrivate::Node<QGesture*,QPointer<QWidget>>::createInPlace<QPointer<QWidget>>
            ((Node<QGesture_*,_QPointer<QWidget>_> *)in_stack_ffffffffffffff90,
             (QGesture **)in_stack_ffffffffffffff88,(QPointer<QWidget> *)0x32ecf3);
  it.bucket = in_stack_ffffffffffffff98;
  it.d = in_stack_ffffffffffffff90;
  QHash<QGesture_*,_QPointer<QWidget>_>::iterator::iterator(in_stack_ffffffffffffff88,it);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  pVar2.bucket = local_28;
  pVar2.d = local_30;
  return (iterator)pVar2;
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }